

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bov.hpp
# Opt level: O1

void __thiscall
diy::io::BOV::set_shape<std::vector<int,std::allocator<int>>>
          (BOV *this,vector<int,_std::allocator<int>_> *shape)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  iterator __position;
  iterator __position_00;
  bool bVar2;
  unsigned_long in_RAX;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long local_38;
  
  piVar3 = (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  puVar1 = (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this_00 = &this->stride_;
  piVar3 = (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    uVar4 = 0;
    uVar5 = 1;
    local_38 = in_RAX;
    do {
      __position._M_current =
           (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->shape_,__position,piVar3 + uVar4);
      }
      else {
        *__position._M_current = piVar3[uVar4];
        (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      local_38 = 1;
      __position_00._M_current =
           (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,__position_00,&local_38);
      }
      else {
        *__position_00._M_current = 1;
        (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      piVar3 = (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  piVar3 = (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar3 == 8) {
    puVar1 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *puVar1 = (long)piVar3[1] * puVar1[1];
  }
  puVar1 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar1 = (long)piVar3[1] * puVar1[1];
  return;
}

Assistant:

void          set_shape(const S& shape)
      {
        shape_.clear();
        stride_.clear();
        for (unsigned i = 0; i < shape.size(); ++i)
        {
            shape_.push_back(shape[i]);
            stride_.push_back(1);
        }
        for (auto i = shape_.size() - 2; i ==  0; --i)
          stride_[i] = stride_[i+1] * shape_[i+1];
        stride_[0] = stride_[1] * shape_[1];
      }